

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

void recharge(obj *obj,int curse_bless)

{
  ushort uVar1;
  obj *poVar2;
  char cVar3;
  char cVar4;
  schar sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  monst *pmVar10;
  long lVar11;
  byte bVar12;
  char *pcVar13;
  char cVar14;
  int tmp;
  int iVar15;
  char *pcVar16;
  obj *poVar17;
  int iVar18;
  bool bVar19;
  bool bVar20;
  long local_38;
  
  if (-1 < curse_bless) {
    obj->field_0x4a = obj->field_0x4a | 0x10;
  }
  cVar3 = obj->oclass;
  if (cVar3 == '\x04') {
    if ((objects[obj->otyp].field_0x10 & 0x20) != 0) {
      if (curse_bless < 1) {
        uVar8 = 1;
        if (curse_bless < 0) {
          uVar8 = mt_random();
          uVar8 = ~uVar8 | 0xfffffffe;
        }
      }
      else {
        uVar8 = mt_random();
        uVar8 = uVar8 % 3 + 1;
      }
      bVar20 = uleft == obj;
      bVar19 = uright == obj;
      cVar3 = obj->spe;
      uVar6 = mt_random();
      poVar17 = uleft;
      if (((int)cVar3 <= (int)(uVar6 % 6 + 3)) && ((-1 < curse_bless || (-5 < obj->spe)))) {
        pcVar16 = xname(obj);
        pcVar13 = "";
        if ((int)uVar8 < 0) {
          pcVar13 = "counter";
        }
        pline("Your %s spins %sclockwise for a moment.",pcVar16,pcVar13);
        if (!bVar19 && !bVar20) {
          obj->spe = obj->spe + (char)uVar8;
          return;
        }
        Ring_off(obj);
        obj->spe = obj->spe + (char)uVar8;
        setworn(obj,(ulong)(poVar17 != obj) * 0x20000 + 0x20000);
        Ring_on(obj,'\0');
        return;
      }
      pcVar16 = xname(obj);
      pcVar13 = otense(obj,"pulsate");
      pcVar9 = otense(obj,"explode");
      pline("Your %s %s momentarily, then %s!",pcVar16,pcVar13,pcVar9);
      if (bVar19 || bVar20) {
        Ring_gone(obj);
      }
      bVar12 = obj->spe >> 7;
      bVar12 = (obj->spe ^ bVar12) - bVar12;
      uVar8 = mt_random();
      useup(obj);
      losehp(uVar8 % ((uint)bVar12 + (uint)bVar12 * 2) + 1,"exploding ring",0);
      return;
    }
    goto switchD_0022e16d_caseD_e9;
  }
  if (cVar3 != '\x06') {
    if (cVar3 == '\v') {
      if (obj->spe == -1) {
        obj->spe = '\0';
      }
      uVar8 = *(uint *)&obj->field_0x4a;
      uVar6 = uVar8 >> 0x10 & 7;
      if ((uVar6 != 0) &&
         ((obj->otyp == 0x1c2 || (uVar7 = mt_random(), uVar7 % 0x157 < uVar6 * uVar6 * uVar6)))) {
LAB_0022e095:
        wand_explode(obj);
        return;
      }
      *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfff8ffff | uVar8 + 0x10000 & 0x70000
      ;
      if (curse_bless < 0) goto LAB_0022e6ba;
      iVar18 = 3;
      iVar15 = 3;
      if ((long)obj->otyp != 0x1c2) {
        iVar15 = 8;
        if ((*(ushort *)&objects[obj->otyp].field_0x11 & 0xc) == 4) {
          iVar15 = 0xf;
        }
      }
      if (iVar15 != 3) {
        uVar8 = mt_random();
        iVar18 = iVar15 + uVar8 % 5 + -4;
      }
      if (curse_bless < 1) {
        uVar8 = mt_random();
        iVar18 = SUB164(ZEXT416(uVar8) % SEXT816((long)iVar18),0) + 1;
      }
      cVar3 = obj->spe + '\x01';
      if (obj->spe < iVar18) {
        cVar3 = (char)iVar18;
      }
      obj->spe = cVar3;
      if ((obj->otyp == 0x1c2) && ('\x03' < cVar3)) goto LAB_0022e095;
      if (cVar3 < iVar15) goto LAB_0022e6fe;
      goto LAB_0022e69d;
    }
    goto switchD_0022e16d_caseD_e9;
  }
  uVar8 = *(uint *)&obj->field_0x4a;
  uVar6 = uVar8 >> 0x10 & 7;
  if (uVar6 != 7) {
    *(uint *)&obj->field_0x4a = uVar8 & 0xfff8ffff | uVar8 + 0x10000 & 0x70000;
  }
  uVar1 = obj->otyp;
  switch(uVar1) {
  case 0xe7:
  case 0xe8:
    if (curse_bless < 0) {
      stripspe(obj);
      if ((obj->field_0x4c & 8) == 0) {
        return;
      }
      if ((((u.uprops[0x1e].intrinsic == 0) && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pcVar16 = Tobjnam(obj,"go");
        pline("%s out!",pcVar16);
      }
      end_burn(obj,'\x01');
      return;
    }
    obj->spe = '\x01';
    if (curse_bless < 1) {
      iVar15 = 0x5dc;
      if (obj->age < 0x2ef) {
        iVar15 = obj->age + 0x2ee;
      }
      obj->age = iVar15;
      goto LAB_0022e6fe;
    }
    obj->age = 0x5dc;
    break;
  case 0xea:
  case 0xf3:
  case 0xf7:
    if (curse_bless < 0) goto LAB_0022e6ba;
    if (uVar1 == 0xf7 && uVar6 != 0) {
      *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfff8ffff | 0x10000;
      if (obj->spe < '\x03') {
        pcVar16 = "Your marker seems permanently dried out.";
        goto LAB_0022e489;
      }
LAB_0022e5d5:
      pcVar16 = "Nothing happens.";
      goto LAB_0022e489;
    }
    uVar8 = mt_random();
    if (curse_bless < 1) {
      iVar18 = (uVar8 - (uVar8 / 0xb + (uVar8 / 0xb) * 10)) + (int)obj->spe + 10;
      iVar15 = 0x7f;
      if (iVar18 < 0x7f) {
        iVar15 = iVar18;
      }
      sVar5 = '2';
      if (0x32 < iVar18) {
        sVar5 = (schar)iVar15;
      }
      obj->spe = sVar5;
      pcVar16 = "dark white";
      goto LAB_0022e6a4;
    }
    iVar18 = (int)obj->spe + (uVar8 & 0xf) + 0xf;
    iVar15 = 0x32;
    if (((0x32 < iVar18) && (iVar15 = 0x4b, 0x4b < iVar18)) && (iVar15 = 0x7f, iVar18 < 0x7f)) {
      iVar15 = iVar18;
    }
    obj->spe = (schar)iVar15;
    break;
  case 0xec:
    if (curse_bless < 0) goto LAB_0022e6ba;
    if (curse_bless < 1) {
      if (obj->spe < '\x05') {
        obj->spe = obj->spe + '\x01';
        goto LAB_0022e6fe;
      }
      goto LAB_0022e5d5;
    }
    obj->spe = '\x06';
    break;
  case 0xf5:
switchD_0022e16d_caseD_f5:
    if (curse_bless < 0) {
LAB_0022e6ba:
      stripspe(obj);
      return;
    }
    if (curse_bless < 1) {
      uVar8 = mt_random();
      cVar3 = (char)uVar8 + (char)(uVar8 / 5) * -5 + obj->spe;
      cVar4 = cVar3 + '\x01';
      bVar20 = SBORROW1(cVar4,'2');
      cVar3 = cVar3 + -0x31;
      cVar14 = '2';
LAB_0022e6f8:
      if (bVar20 != cVar3 < '\0') {
        cVar14 = cVar4;
      }
      obj->spe = cVar14;
LAB_0022e6fe:
      p_glow1(obj);
      return;
    }
    cVar3 = obj->spe;
    uVar8 = mt_random();
    cVar3 = (char)(uVar8 % ((uint)(cVar3 < '\v') * 5 + 5)) + obj->spe;
    cVar14 = cVar3 + '\x06';
    bVar20 = SBORROW1(cVar14,'2');
    cVar3 = cVar3 + -0x2c;
    cVar4 = '2';
LAB_0022e697:
    if (bVar20 != cVar3 < '\0') {
      cVar4 = cVar14;
    }
    obj->spe = cVar4;
    break;
  default:
    uVar8 = uVar1 - 0xfd;
    if (uVar8 < 0x10) {
      if ((0x44dU >> (uVar8 & 0x1f) & 1) == 0) {
        if (uVar8 == 4) goto switchD_0022e16d_caseD_f5;
        if (uVar8 == 0xf) {
          if (curse_bless < 0) {
            stripspe(obj);
          }
          else if (curse_bless < 1) {
            obj->spe = obj->spe + '\x01';
          }
          else {
            uVar8 = mt_random();
            obj->spe = (char)uVar8 + (char)(uVar8 / 3) * -3 + obj->spe + '\x01';
          }
          if (obj->spe < '\x06') {
            return;
          }
          obj->spe = '\x05';
          return;
        }
        goto LAB_0022e3cc;
      }
      if (curse_bless < 0) goto LAB_0022e6ba;
      if (curse_bless < 1) {
        uVar8 = mt_random();
        cVar3 = ((byte)uVar8 & 3) + obj->spe;
        cVar4 = cVar3 + '\x01';
        bVar20 = SBORROW1(cVar4,'\x14');
        cVar3 = cVar3 + -0x13;
        cVar14 = '\x14';
        goto LAB_0022e6f8;
      }
      iVar15 = 2;
      iVar18 = -2;
      do {
        uVar8 = mt_random();
        iVar15 = iVar15 + (uVar8 & 3);
        iVar18 = iVar18 + 1;
      } while (iVar18 != 0);
      cVar14 = (char)iVar15 + obj->spe;
      bVar20 = SBORROW1(cVar14,'\x14');
      cVar3 = cVar14 + -0x14;
      cVar4 = '\x14';
      goto LAB_0022e697;
    }
LAB_0022e3cc:
    if (uVar1 == 0xe1) {
      if (curse_bless < 0) goto LAB_0022e6ba;
      discover_object(0xe1,'\x01','\x01');
      if (obj->cobj == (obj *)0x0) {
        uVar8 = 0;
        local_38 = 0;
      }
      else {
        local_38 = 0;
        uVar8 = 0;
        poVar17 = obj->cobj;
        do {
          poVar2 = poVar17->nobj;
          obj_extract_self(poVar17);
          if (((u.ushops[0] != '\0') &&
              (pmVar10 = shop_keeper(level,u.ushops[0]), pmVar10 != (monst *)0x0)) &&
             ((poVar17->field_0x4a & 4) != 0)) {
            lVar11 = stolen_value(poVar17,u.ux,u.uy,
                                  (byte)(*(uint *)&pmVar10->field_0x60 >> 0x16) & 1,'\x01');
            local_38 = local_38 + lVar11;
          }
          obfree(poVar17,(obj *)0x0);
          uVar8 = uVar8 + 1;
          poVar17 = poVar2;
        } while (poVar2 != (obj *)0x0);
      }
      if (uVar8 != 0) {
        pcVar16 = yname(obj);
        You_hear("loud crunching sounds from inside %s.",pcVar16);
        if (local_38 != 0) {
          pcVar16 = currency(local_38);
          pcVar13 = "";
          if (1 < uVar8) {
            pcVar13 = "s";
          }
          pline("You owe %ld %s for lost item%s.",local_38,pcVar16,pcVar13);
        }
      }
      goto switchD_0022e16d_caseD_f5;
    }
  case 0xe9:
  case 0xeb:
  case 0xed:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf1:
  case 0xf2:
  case 0xf4:
  case 0xf6:
switchD_0022e16d_caseD_e9:
    pcVar16 = "You have a feeling of loss.";
LAB_0022e489:
    pline(pcVar16);
    return;
  }
LAB_0022e69d:
  pcVar16 = "dark blue";
LAB_0022e6a4:
  p_glow2(obj,pcVar16 + 5);
  return;
}

Assistant:

void recharge(struct obj *obj, int curse_bless)
{
	int n;
	boolean is_cursed, is_blessed;

	is_cursed = curse_bless < 0;
	is_blessed = curse_bless > 0;

	/* Scrolls of charging now ID charge count, as well as doing
	 * the charging, unless cursed. */
	if (!is_cursed) obj->known = 1;

	if (obj->oclass == WAND_CLASS) {
	    /* undo any prior cancellation, even when is_cursed */
	    if (obj->spe == -1) obj->spe = 0;

	    /*
	     * Recharging might cause wands to explode.
	     *	v = number of previous recharges
	     *	      v = percentage chance to explode on this attempt
	     *		      v = cumulative odds for exploding
	     *	0 :   0       0
	     *	1 :   0.29    0.29
	     *	2 :   2.33    2.62
	     *	3 :   7.87   10.28
	     *	4 :  18.66   27.02
	     *	5 :  36.44   53.62
	     *	6 :  62.97   82.83
	     *	7 : 100     100
	     */
	    n = (int)obj->recharged;
	    if (n > 0 && (obj->otyp == WAN_WISHING ||
		    (n * n * n > rn2(7*7*7)))) {	/* recharge_limit */
		wand_explode(obj);
		return;
	    }
	    /* didn't explode, so increment the recharge count */
	    obj->recharged = (unsigned)(n + 1);

	    /* now handle the actual recharging */
	    if (is_cursed) {
		stripspe(obj);
	    } else {
		int lim = (obj->otyp == WAN_WISHING) ? 3 :
			(objects[obj->otyp].oc_dir != NODIR) ? 8 : 15;

		n = (lim == 3) ? 3 : rn1(5, lim + 1 - 5);
		if (!is_blessed) n = rnd(n);

		if (obj->spe < n) obj->spe = n;
		else obj->spe++;
		if (obj->otyp == WAN_WISHING && obj->spe > 3) {
		    wand_explode(obj);
		    return;
		}
		if (obj->spe >= lim) p_glow2(obj, "blue");
		else p_glow1(obj);
	    }

	} else if (obj->oclass == RING_CLASS &&
					objects[obj->otyp].oc_charged) {
	    /* charging does not affect ring's curse/bless status */
	    int s = is_blessed ? rnd(3) : is_cursed ? -rnd(2) : 1;
	    boolean is_on = (obj == uleft || obj == uright);

	    /* destruction depends on current state, not adjustment */
	    if (obj->spe > rn2(6) + 3 || (is_cursed && obj->spe <= -5)) {
		pline("Your %s %s momentarily, then %s!",
		     xname(obj), otense(obj,"pulsate"), otense(obj,"explode"));
		if (is_on) Ring_gone(obj);
		s = rnd(3 * abs(obj->spe));	/* amount of damage */
		useup(obj);
		losehp(s, "exploding ring", KILLED_BY_AN);
	    } else {
		long mask = is_on ? (obj == uleft ? LEFT_RING :
				     RIGHT_RING) : 0L;
		pline("Your %s spins %sclockwise for a moment.",
		     xname(obj), s < 0 ? "counter" : "");
		/* cause attributes and/or properties to be updated */
		if (is_on) Ring_off(obj);
		obj->spe += s;	/* update the ring while it's off */
		if (is_on) setworn(obj, mask), Ring_on(obj, FALSE);
		/* oartifact: if a touch-sensitive artifact ring is
		   ever created the above will need to be revised  */
	    }

	} else if (obj->oclass == TOOL_CLASS) {
	    int rechrg = (int)obj->recharged;

	    /* tools don't have a limit, but the counter used does */
	    if (rechrg < 7)	/* recharge_limit */
		obj->recharged++;

	    switch(obj->otyp) {
	    case BELL_OF_OPENING:
		if (is_cursed) stripspe(obj);
		else if (is_blessed) obj->spe += rnd(3);
		else obj->spe += 1;
		if (obj->spe > 5) obj->spe = 5;
		break;
	    case MAGIC_MARKER:
	    case TINNING_KIT:
	    case EXPENSIVE_CAMERA:
		if (is_cursed) stripspe(obj);
		else if (rechrg && obj->otyp == MAGIC_MARKER) {	/* previously recharged */
		    obj->recharged = 1;	/* override increment done above */
		    if (obj->spe < 3)
			pline("Your marker seems permanently dried out.");
		    else
			pline("Nothing happens.");
		} else if (is_blessed) {
		    n = rn1(16,15);		/* 15..30 */
		    if (obj->spe + n <= 50)
			obj->spe = 50;
		    else if (obj->spe + n <= 75)
			obj->spe = 75;
		    else {
			int chrg = (int)obj->spe;
			if ((chrg + n) > 127)
				obj->spe = 127;
			else
				obj->spe += n;
		    }
		    p_glow2(obj, "blue");
		} else {
		    n = rn1(11,10);		/* 10..20 */
		    if (obj->spe + n <= 50)
			obj->spe = 50;
		    else {
			int chrg = (int)obj->spe;
			if ((chrg + n) > 127)
				obj->spe = 127;
			else
				obj->spe += n;
		    }
		    p_glow2(obj, "white");
		}
		break;
	    case OIL_LAMP:
	    case BRASS_LANTERN:
		if (is_cursed) {
		    stripspe(obj);
		    if (obj->lamplit) {
			if (!Blind)
			    pline("%s out!", Tobjnam(obj, "go"));
			end_burn(obj, TRUE);
		    }
		} else if (is_blessed) {
		    obj->spe = 1;
		    obj->age = 1500;
		    p_glow2(obj, "blue");
		} else {
		    obj->spe = 1;
		    obj->age += 750;
		    if (obj->age > 1500) obj->age = 1500;
		    p_glow1(obj);
		}
		break;
	    case CRYSTAL_BALL:
		if (is_cursed) stripspe(obj);
		else if (is_blessed) {
		    obj->spe = 6;
		    p_glow2(obj, "blue");
		} else {
		    if (obj->spe < 5) {
			obj->spe++;
			p_glow1(obj);
		    } else pline("Nothing happens.");
		}
		break;
	    case BAG_OF_TRICKS:
		/* if there are any objects inside the bag, devour them */
		if (!is_cursed) {
		    struct obj *curr, *otmp;
		    struct monst *shkp;
		    int lcnt = 0;
		    long loss = 0L;

		    makeknown(BAG_OF_TRICKS);
		    for (curr = obj->cobj; curr; curr = otmp) {
			otmp = curr->nobj;
			obj_extract_self(curr);
			lcnt++;
			if (*u.ushops && (shkp = shop_keeper(level, *u.ushops)) != 0) {
			    if (curr->unpaid)
				loss += stolen_value(curr, u.ux, u.uy,
						     (boolean)shkp->mpeaceful, TRUE);
			}
			/* obfree() will free all contained objects */
			obfree(curr, NULL);
		    }

		    if (lcnt)
			You_hear("loud crunching sounds from inside %s.", yname(obj));
		    if (lcnt && loss)
			pline("You owe %ld %s for lost item%s.",
			      loss, currency(loss), lcnt > 1 ? "s" : "");
		}
		/* fall through */
	    case HORN_OF_PLENTY:
	    case CAN_OF_GREASE:
		if (is_cursed) stripspe(obj);
		else if (is_blessed) {
		    if (obj->spe <= 10)
			obj->spe += rn1(10, 6);
		    else obj->spe += rn1(5, 6);
		    if (obj->spe > 50) obj->spe = 50;
		    p_glow2(obj, "blue");
		} else {
		    obj->spe += rnd(5);
		    if (obj->spe > 50) obj->spe = 50;
		    p_glow1(obj);
		}
		break;
	    case MAGIC_FLUTE:
	    case MAGIC_HARP:
	    case FROST_HORN:
	    case FIRE_HORN:
	    case DRUM_OF_EARTHQUAKE:
		if (is_cursed) {
		    stripspe(obj);
		} else if (is_blessed) {
		    obj->spe += dice(2,4);
		    if (obj->spe > 20) obj->spe = 20;
		    p_glow2(obj, "blue");
		} else {
		    obj->spe += rnd(4);
		    if (obj->spe > 20) obj->spe = 20;
		    p_glow1(obj);
		}
		break;
	    default:
		goto not_chargable;
		/*NOTREACHED*/
		break;
	    } /* switch */

	} else {
 not_chargable:
	    pline("You have a feeling of loss.");
	}
}